

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_TakeInventory(FParser *this)

{
  AActor *actor;
  uint uVar1;
  int amount;
  char *type;
  
  if (1 < this->t_argc) {
    uVar1 = T_GetPlayerNum(this->t_argv);
    if (uVar1 != 0xffffffff) {
      amount = 0x7fff;
      if (this->t_argc != 2) {
        amount = intvalue(this->t_argv + 2);
      }
      actor = (AActor *)(&players)[(ulong)uVar1 * 0x54];
      type = stringvalue(this->t_argv + 1);
      FS_TakeInventory(actor,type,amount);
      (this->t_return).type = 1;
      (this->t_return).value.i = 0;
    }
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_TakeInventory(void)
{
	int  playernum, count;

	if (CheckArgs(2))
	{
		playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum==-1) return;

		if(t_argc == 2) count=32767;
		else count=intvalue(t_argv[2]);
		FS_TakeInventory(players[playernum].mo, stringvalue(t_argv[1]), count);
		t_return.type = svt_int;
		t_return.value.i = 0;
	}
}